

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::SaveTraceForBugreportResponse::operator==
          (SaveTraceForBugreportResponse *this,SaveTraceForBugreportResponse *other)

{
  __type_conflict4 _Var1;
  __type_conflict4 local_19;
  SaveTraceForBugreportResponse *other_local;
  SaveTraceForBugreportResponse *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if ((_Var1) && (local_19 = false, (this->success_ & 1U) == (other->success_ & 1U))) {
    local_19 = ::std::operator==(&this->msg_,&other->msg_);
  }
  return local_19;
}

Assistant:

bool SaveTraceForBugreportResponse::operator==(const SaveTraceForBugreportResponse& other) const {
  return unknown_fields_ == other.unknown_fields_
   && success_ == other.success_
   && msg_ == other.msg_;
}